

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::getEnterVals2
          (SPxSolverBase<double> *this,int leaveIdx,double enterMax,double *leavebound,
          StableSum<double> *objChange)

{
  int iVar1;
  Status SVar2;
  VectorBase<double> *pVVar3;
  pointer pdVar4;
  undefined8 *puVar5;
  Status *pSVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  SPxId leftId;
  DataKey local_60;
  long local_58;
  undefined1 local_50 [16];
  double local_40;
  DataKey local_38;
  
  local_38 = (this->super_SPxBasisBase<double>).theBaseId.data[leaveIdx].super_DataKey;
  local_40 = enterMax;
  if (-1 < local_38.info) {
    SPxColId::SPxColId((SPxColId *)&local_60,(SPxId *)&local_38);
    iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set,&local_60);
    pSVar6 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    lVar7 = (long)iVar1;
    switch(pSVar6[lVar7]) {
    case D_FREE:
      pVVar3 = &this->theUBbound;
      if (0.0 < local_40 *
                (this->theFvec->thedelta).super_VectorBase<double>.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[leaveIdx]) {
        pVVar3 = &this->theLBbound;
      }
      dVar8 = (pVVar3->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[leaveIdx];
      *leavebound = dVar8;
      (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = dVar8;
      (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = dVar8;
      dVar8 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar7] * *leavebound;
LAB_001c2cc9:
      dVar9 = objChange->sum;
      dVar10 = dVar9 + dVar8;
      objChange->c = (dVar8 - (dVar10 - dVar9)) + (dVar9 - (dVar10 - (dVar10 - dVar9))) +
                     objChange->c;
      objChange->sum = dVar10;
      pSVar6[lVar7] = P_FIXED;
      return;
    case D_ON_LOWER:
switchD_001c2a12_caseD_4:
      dVar8 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[leaveIdx];
      *leavebound = dVar8;
      (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = dVar8;
      dVar8 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar7] * *leavebound;
LAB_001c2e37:
      dVar9 = objChange->sum;
      dVar10 = dVar9 + dVar8;
      objChange->c = (dVar8 - (dVar10 - dVar9)) + (dVar9 - (dVar10 - (dVar10 - dVar9))) +
                     objChange->c;
      objChange->sum = dVar10;
      pSVar6[lVar7] = P_ON_UPPER;
      return;
    case D_ON_BOTH:
    case D_UNDEFINED:
      if (local_40 *
          (this->theFvec->thedelta).super_VectorBase<double>.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[leaveIdx] < 0.0) goto switchD_001c2a12_caseD_4;
    case D_ON_UPPER:
      dVar8 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[leaveIdx];
      *leavebound = dVar8;
      (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = dVar8;
      dVar8 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar7] * *leavebound;
LAB_001c2dc3:
      dVar9 = objChange->sum;
      dVar10 = dVar9 + dVar8;
      objChange->c = (dVar8 - (dVar10 - dVar9)) + (dVar9 - (dVar10 - (dVar10 - dVar9))) +
                     objChange->c;
      objChange->sum = dVar10;
      pSVar6[lVar7] = P_ON_LOWER;
      return;
    case P_FIXED:
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_60 = (DataKey)local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"XENTER08 This should never happen.","");
      *puVar5 = &PTR__SPxException_006a9ee8;
      puVar5[1] = puVar5 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar5 + 1),local_60,(undefined1 *)(local_58 + (long)local_60));
      *puVar5 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_60 = (DataKey)local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"XENTER09 This should never happen.","");
      *puVar5 = &PTR__SPxException_006a9ee8;
      puVar5[1] = puVar5 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar5 + 1),local_60,(undefined1 *)(local_58 + (long)local_60));
      *puVar5 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      dVar8 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[leaveIdx];
      *leavebound = dVar8;
      pdVar4 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      break;
    case P_ON_UPPER:
      dVar8 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[leaveIdx];
      *leavebound = dVar8;
      pdVar4 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      break;
    case P_FREE:
      local_40 = local_40 *
                 (this->theFvec->thedelta).super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[leaveIdx];
      pVVar3 = &this->theUBbound;
      if (0.0 < local_40) {
        pVVar3 = &this->theLBbound;
      }
      dVar8 = (pVVar3->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[leaveIdx];
      pVVar3 = &this->theLCbound;
      if (local_40 <= 0.0) {
        pVVar3 = &this->theUCbound;
      }
      *leavebound = dVar8;
      (pVVar3->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = dVar8;
      pSVar6[lVar7] = D_UNDEFINED;
      return;
    }
    pdVar4[lVar7] = dVar8;
    SVar2 = SPxBasisBase<double>::dualColStatus(&this->super_SPxBasisBase<double>,iVar1);
    (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar7] = SVar2;
    if (SVar2 == D_ON_BOTH) {
      dVar9 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7] *
              (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar7];
      dVar8 = objChange->sum;
      dVar10 = dVar8 + dVar9;
      dVar9 = (dVar9 - (dVar10 - dVar8)) + (dVar8 - (dVar10 - (dVar10 - dVar8))) + objChange->c;
      objChange->c = dVar9;
      objChange->sum = dVar10;
      dVar8 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      pdVar4 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
LAB_001c2faf:
      dVar11 = dVar10 + dVar8 * pdVar4[lVar7];
      objChange->c = (dVar8 * pdVar4[lVar7] - (dVar11 - dVar10)) +
                     (dVar10 - (dVar11 - (dVar11 - dVar10))) + dVar9;
      objChange->sum = dVar11;
    }
    else {
      if (SVar2 == D_ON_LOWER) {
        dVar8 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        pdVar4 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      }
      else {
        if (SVar2 != D_ON_UPPER) {
          return;
        }
        dVar8 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        pdVar4 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      }
LAB_001c2f0d:
      dVar9 = objChange->sum;
      dVar10 = dVar9 + dVar8 * pdVar4[lVar7];
      objChange->c = (dVar8 * pdVar4[lVar7] - (dVar10 - dVar9)) +
                     (dVar9 - (dVar10 - (dVar10 - dVar9))) + objChange->c;
      objChange->sum = dVar10;
    }
    return;
  }
  SPxRowId::SPxRowId((SPxRowId *)&local_60,(SPxId *)&local_38);
  iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                    (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                      super_SVSetBase<double>.set,&local_60);
  pSVar6 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
  lVar7 = (long)iVar1;
  switch(pSVar6[lVar7]) {
  case D_FREE:
    pVVar3 = &this->theLBbound;
    if (local_40 *
        (this->theFvec->thedelta).super_VectorBase<double>.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [leaveIdx] < 0.0) {
      pVVar3 = &this->theUBbound;
    }
    dVar8 = (pVVar3->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[leaveIdx];
    *leavebound = dVar8;
    (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar7] = dVar8;
    (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar7] = *leavebound;
    dVar8 = *leavebound *
            (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[leaveIdx];
    goto LAB_001c2cc9;
  case D_ON_UPPER:
    goto switchD_001c2aa8_caseD_2;
  case D_ON_LOWER:
switchD_001c2aa8_caseD_4:
    dVar8 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[leaveIdx];
    *leavebound = dVar8;
    (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar7] = dVar8;
    dVar8 = *leavebound *
            (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[leaveIdx];
    goto LAB_001c2e37;
  case D_ON_BOTH:
    if (0.0 <= local_40 *
               (this->theFvec->thedelta).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[leaveIdx]) goto switchD_001c2aa8_caseD_4;
    goto switchD_001c2aa8_caseD_2;
  case D_UNDEFINED:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_60 = (DataKey)local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"XENTER06 This should never happen.","");
    *puVar5 = &PTR__SPxException_006a9ee8;
    puVar5[1] = puVar5 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar5 + 1),local_60,(undefined1 *)(local_58 + (long)local_60));
    *puVar5 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_FIXED:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_60 = (DataKey)local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"XENTER04 This should never happen.","");
    *puVar5 = &PTR__SPxException_006a9ee8;
    puVar5[1] = puVar5 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar5 + 1),local_60,(undefined1 *)(local_58 + (long)local_60));
    *puVar5 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  default:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_60 = (DataKey)local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"XENTER07 This should never happen.","");
    *puVar5 = &PTR__SPxException_006a9ee8;
    puVar5[1] = puVar5 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar5 + 1),local_60,(undefined1 *)(local_58 + (long)local_60));
    *puVar5 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    dVar8 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[leaveIdx];
    *leavebound = dVar8;
    pdVar4 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    break;
  case P_ON_UPPER:
    dVar8 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[leaveIdx];
    *leavebound = dVar8;
    pdVar4 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    break;
  case P_FREE:
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_60 = (DataKey)local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"XENTER05 This should never happen.","");
    *puVar5 = &PTR__SPxException_006a9ee8;
    puVar5[1] = puVar5 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar5 + 1),local_60,(undefined1 *)(local_58 + (long)local_60));
    *puVar5 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  pdVar4[lVar7] = dVar8;
  SVar2 = SPxBasisBase<double>::dualRowStatus(&this->super_SPxBasisBase<double>,iVar1);
  (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar7] = SVar2;
  if (SVar2 == D_ON_BOTH) {
    dVar9 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7] *
            (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar7];
    dVar8 = objChange->sum;
    dVar10 = dVar8 + dVar9;
    dVar9 = (dVar9 - (dVar10 - dVar8)) + (dVar8 - (dVar10 - (dVar10 - dVar8))) + objChange->c;
    objChange->c = dVar9;
    objChange->sum = dVar10;
    dVar8 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7];
    pdVar4 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    goto LAB_001c2faf;
  }
  if (SVar2 == D_ON_LOWER) {
    dVar8 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7];
    pdVar4 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  }
  else {
    if (SVar2 != D_ON_UPPER) {
      return;
    }
    dVar8 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7];
    pdVar4 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  }
  goto LAB_001c2f0d;
switchD_001c2aa8_caseD_2:
  dVar8 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[leaveIdx];
  *leavebound = dVar8;
  (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[lVar7] = dVar8;
  dVar8 = *leavebound *
          (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[leaveIdx];
  goto LAB_001c2dc3;
}

Assistant:

void SPxSolverBase<R>::getEnterVals2
(
   int leaveIdx,
   R enterMax,
   R& leavebound,
   StableSum<R>& objChange
)
{
   int idx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();
   SPxId leftId = this->baseId(leaveIdx);

   if(leftId.isSPxRowId())
   {
      idx = this->number(SPxRowId(leftId));
      typename SPxBasisBase<R>::Desc::Status leaveStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == ROW);
         throw SPxInternalCodeException("XENTER04 This should never happen.");
         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         leavebound = theLBbound[leaveIdx];
         theLRbound[idx] = leavebound;
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         switch(ds.rowStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theURbound[idx] * this->lhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theURbound[idx] * this->lhs(idx);
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         leavebound = theUBbound[leaveIdx];
         theURbound[idx] = leavebound;
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         switch(ds.rowStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theURbound[idx] * this->lhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theURbound[idx] * this->lhs(idx);
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
#if 1
         throw SPxInternalCodeException("XENTER05 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER98 ERROR: not yet debugged!" << std::endl;)

         if((*theCoPvec)[leaveIdx] - theLBbound[leaveIdx] <
               theUBbound[leaveIdx] - (*theCoPvec)[leaveIdx])
         {
            leavebound = theLBbound[leaveIdx];
            theLRbound[idx] = leavebound;
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            theURbound[idx] = leavebound;
         }

         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::D_UNDEFINED :
         assert(rep() == COLUMN);
         throw SPxInternalCodeException("XENTER06 This should never happen.");
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);

         if(theFvec->delta()[leaveIdx] * enterMax < 0)
            leavebound = theUBbound[leaveIdx];
         else
            leavebound = theLBbound[leaveIdx];

         theLRbound[idx] = leavebound;
         theURbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         leavebound = theUBbound[leaveIdx];
         theURbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         leavebound = theLBbound[leaveIdx];
         theLRbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if(enterMax * theFvec->delta()[leaveIdx] < 0)
         {
            leavebound = theUBbound[leaveIdx];
            theURbound[idx] = leavebound;
            objChange += leavebound * this->maxRowObj(leaveIdx);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }
         else
         {
            leavebound = theLBbound[leaveIdx];
            theLRbound[idx] = leavebound;
            objChange += leavebound * this->maxRowObj(leaveIdx);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }

         break;

      default:
         throw SPxInternalCodeException("XENTER07 This should never happen.");
      }

      SPxOut::debug(this, "DENTER06 SPxSolverBase::getEnterVals2(): row {}: {} -> {} objChange: {}\n",
                    idx, leaveStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(leftId.isSPxColId());
      idx = this->number(SPxColId(leftId));
      typename SPxBasisBase<R>::Desc::Status leaveStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         leavebound = theLBbound[leaveIdx];
         theLCbound[idx] = leavebound;
         ds.colStatus(idx) = this->dualColStatus(idx);

         switch(ds.colStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLCbound[idx] * this->upper(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theLCbound[idx] * this->upper(idx);
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         leavebound = theUBbound[leaveIdx];
         theUCbound[idx] = leavebound;
         ds.colStatus(idx) = this->dualColStatus(idx);

         switch(ds.colStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLCbound[idx] * this->upper(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theLCbound[idx] * this->upper(idx);
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);

         if(theFvec->delta()[leaveIdx] * enterMax > 0)
         {
            leavebound = theLBbound[leaveIdx];
            theLCbound[idx] = leavebound;
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            theUCbound[idx] = leavebound;
         }

         ds.colStatus(idx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED:
         assert(rep() == ROW);
         throw SPxInternalCodeException("XENTER08 This should never happen.");
         break;

      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);

         if(theFvec->delta()[leaveIdx] * enterMax > 0)
            leavebound = theLBbound[leaveIdx];
         else
            leavebound = theUBbound[leaveIdx];

         theUCbound[idx] =
            theLCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         leavebound = theLBbound[leaveIdx];
         theLCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         leavebound = theUBbound[leaveIdx];
         theUCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
      case SPxBasisBase<R>::Desc::D_UNDEFINED :
         assert(rep() == COLUMN);

         if(enterMax * theFvec->delta()[leaveIdx] < 0)
         {
            leavebound = theUBbound[leaveIdx];
            theUCbound[idx] = leavebound;
            objChange += this->maxObj(idx) * leavebound;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            leavebound = theLBbound[leaveIdx];
            theLCbound[idx] = leavebound;
            objChange += this->maxObj(idx) * leavebound;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         break;

      default:
         throw SPxInternalCodeException("XENTER09 This should never happen.");
      }

      SPxOut::debug(this, "DENTER07 SPxSolverBase::getEnterVals2(): col {}: {} -> {} objChange: {}\n",
                    idx, leaveStat, ds.colStatus(idx), objChange);
   }
}